

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

bool ImGui::ImageButtonEx
               (ImGuiID id,ImTextureID texture_id,ImVec2 *size,ImVec2 *uv0,ImVec2 *uv1,
               ImVec2 *padding,ImVec4 *bg_col,ImVec4 *tint_col)

{
  ImGuiWindow *pIVar1;
  ImDrawList *pIVar2;
  ImVec2 p_min;
  ImVec2 p_max;
  ImGuiContext *pIVar3;
  bool bVar4;
  bool bVar5;
  ImU32 IVar6;
  ImGuiNavHighlightFlags flags;
  bool *out_held;
  int iVar7;
  ImGuiCol idx;
  ImGuiContext *g;
  float fVar8;
  float fVar9;
  bool local_6e;
  bool local_6d;
  ImU32 local_6c;
  ImRect local_68;
  ImTextureID local_58;
  ImVec2 *local_50;
  ImVec2 *local_48;
  ImVec2 local_40;
  ImVec2 local_38;
  
  pIVar3 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  pIVar1->WriteAccessed = true;
  if (pIVar1->SkipItems == false) {
    local_68.Min.x = (pIVar1->DC).CursorPos.x;
    local_68.Min.y = (pIVar1->DC).CursorPos.y;
    fVar8 = (*padding).x;
    fVar9 = (*padding).y;
    local_68.Max.x = fVar8 + fVar8 + (*size).x + local_68.Min.x;
    local_68.Max.y = fVar9 + fVar9 + (*size).y + local_68.Min.y;
    local_58 = texture_id;
    local_50 = uv0;
    local_48 = uv1;
    ItemSize(&local_68,-1.0);
    bVar5 = false;
    bVar4 = ItemAdd(&local_68,id,(ImRect *)0x0);
    if (bVar4) {
      out_held = &local_6e;
      bVar5 = ButtonBehavior(&local_68,id,&local_6d,out_held,0);
      flags = (ImGuiNavHighlightFlags)CONCAT71((int7)((ulong)out_held >> 8),local_6e);
      iVar7 = ((local_6e ^ 1U) & local_6d) + 0x15;
      idx = 0x17;
      if ((local_6d & 1U) == 0) {
        idx = iVar7;
      }
      if (local_6e == false) {
        idx = iVar7;
      }
      local_6c = GetColorU32(idx,1.0);
      RenderNavHighlight((ImGui *)&local_68,(ImRect *)(ulong)id,1,flags);
      p_min.y = local_68.Min.y;
      p_min.x = local_68.Min.x;
      p_max.y = local_68.Max.y;
      p_max.x = local_68.Max.x;
      fVar8 = padding->x;
      if (padding->y <= padding->x) {
        fVar8 = padding->y;
      }
      fVar9 = (pIVar3->Style).FrameRounding;
      if (fVar8 <= fVar9) {
        fVar9 = fVar8;
      }
      RenderFrame(p_min,p_max,local_6c,true,(float)(~-(uint)(fVar8 < 0.0) & (uint)fVar9));
      if (0.0 < bg_col->w) {
        pIVar2 = pIVar1->DrawList;
        fVar8 = (*padding).x;
        fVar9 = (*padding).y;
        local_38.x = local_68.Min.x + fVar8;
        local_38.y = local_68.Min.y + fVar9;
        local_40.x = local_68.Max.x - fVar8;
        local_40.y = local_68.Max.y - fVar9;
        IVar6 = GetColorU32(bg_col);
        ImDrawList::AddRectFilled(pIVar2,&local_38,&local_40,IVar6,0.0,0xf);
      }
      pIVar2 = pIVar1->DrawList;
      fVar8 = (*padding).x;
      fVar9 = (*padding).y;
      local_38.x = local_68.Min.x + fVar8;
      local_38.y = local_68.Min.y + fVar9;
      local_40.x = local_68.Max.x - fVar8;
      local_40.y = local_68.Max.y - fVar9;
      IVar6 = GetColorU32(tint_col);
      ImDrawList::AddImage(pIVar2,local_58,&local_38,&local_40,local_50,local_48,IVar6);
    }
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool ImGui::ImageButtonEx(ImGuiID id, ImTextureID texture_id, const ImVec2& size, const ImVec2& uv0, const ImVec2& uv1, const ImVec2& padding, const ImVec4& bg_col, const ImVec4& tint_col)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    const ImRect bb(window->DC.CursorPos, window->DC.CursorPos + size + padding * 2);
    ItemSize(bb);
    if (!ItemAdd(bb, id))
        return false;

    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held);

    // Render
    const ImU32 col = GetColorU32((held && hovered) ? ImGuiCol_ButtonActive : hovered ? ImGuiCol_ButtonHovered : ImGuiCol_Button);
    RenderNavHighlight(bb, id);
    RenderFrame(bb.Min, bb.Max, col, true, ImClamp((float)ImMin(padding.x, padding.y), 0.0f, g.Style.FrameRounding));
    if (bg_col.w > 0.0f)
        window->DrawList->AddRectFilled(bb.Min + padding, bb.Max - padding, GetColorU32(bg_col));
    window->DrawList->AddImage(texture_id, bb.Min + padding, bb.Max - padding, uv0, uv1, GetColorU32(tint_col));

    return pressed;
}